

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall xs::posix::CaseListWriter::run(CaseListWriter *this)

{
  deFile *file;
  bool bVar1;
  deInt64 dVar2;
  deFileResult dVar3;
  size_type sVar4;
  reference pvVar5;
  long lStack_20;
  deFileResult result;
  deInt64 numWritten;
  deInt64 pos;
  CaseListWriter *this_local;
  
  numWritten = 0;
  pos = (deInt64)this;
  while( true ) {
    dVar2 = numWritten;
    bVar1 = false;
    if ((this->m_run & 1U) != 0) {
      sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_caseList);
      bVar1 = dVar2 < (long)sVar4;
    }
    if (!bVar1) break;
    lStack_20 = 0;
    file = this->m_file;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_caseList,0);
    pvVar5 = pvVar5 + numWritten;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_caseList);
    dVar3 = deFile_write(file,pvVar5,sVar4 - numWritten,&stack0xffffffffffffffe0);
    if (dVar3 == DE_FILERESULT_SUCCESS) {
      numWritten = lStack_20 + numWritten;
    }
    else {
      if (dVar3 != DE_FILERESULT_WOULD_BLOCK) {
        return;
      }
      deSleep(1);
    }
  }
  return;
}

Assistant:

void CaseListWriter::run (void)
{
	deInt64 pos = 0;

	while (m_run && pos < (deInt64)m_caseList.size())
	{
		deInt64			numWritten	= 0;
		deFileResult	result		= deFile_write(m_file, &m_caseList[0] + pos, m_caseList.size()-pos, &numWritten);

		if (result == DE_FILERESULT_SUCCESS)
			pos += numWritten;
		else if (result == DE_FILERESULT_WOULD_BLOCK)
			deSleep(1); // Yield.
		else
			break; // Error.
	}
}